

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

void __thiscall
tchecker::parsing::system::parser_t::symbol_type::symbol_type
          (symbol_type *this,int tok,location_type l)

{
  bool local_16;
  int tok_local;
  symbol_type *this_local;
  
  basic_symbol<tchecker::parsing::system::parser_t::by_kind>::basic_symbol
            (&this->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>,tok,&l);
  local_16 = true;
  if ((tok != 0) &&
     (((tok < 0x100 || (local_16 = true, 0x10a < tok)) && (local_16 = true, tok != 0x10c)))) {
    local_16 = 0x10d < tok && tok < 0x112;
  }
  if (!local_16) {
    __assert_fail("tok == token::TOK_EOF || (token::SPYYerror <= tok && tok <= token::TOK_EVENT) || tok == token::TOK_INT || (token::TOK_LOCATION <= tok && tok <= token::TOK_SYSTEM)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x3b5,
                  "tchecker::parsing::system::parser_t::symbol_type::symbol_type(int, location_type)"
                 );
  }
  return;
}

Assistant:

symbol_type (int tok, const location_type& l)
        : super_type (token_kind_type (tok), l)
#endif
      {
#if !defined _MSC_VER || defined __clang__
        SPYY_ASSERT (tok == token::TOK_EOF
                   || (token::SPYYerror <= tok && tok <= token::TOK_EVENT)
                   || tok == token::TOK_INT
                   || (token::TOK_LOCATION <= tok && tok <= token::TOK_SYSTEM));
#endif
      }